

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

ggml_tensor * ggml_argmax(ggml_context *ctx,ggml_tensor *a)

{
  ggml_tensor *pgVar1;
  char *pcVar2;
  int line;
  int64_t local_10;
  
  if ((a->ne[2] == 1) && (a->ne[3] == 1)) {
    if (a->ne[0] < 0x80000000) {
      local_10 = a->ne[1];
      pgVar1 = ggml_new_tensor_impl(ctx,GGML_TYPE_I32,1,&local_10,(ggml_tensor *)0x0,0);
      pgVar1->op = GGML_OP_ARGMAX;
      pgVar1->src[0] = a;
      return pgVar1;
    }
    pcVar2 = "a->ne[0] <= INT32_MAX";
    line = 0x8e5;
  }
  else {
    pcVar2 = "ggml_is_matrix(a)";
    line = 0x8e4;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c",
             line,"GGML_ASSERT(%s) failed",pcVar2);
}

Assistant:

struct ggml_tensor * ggml_argmax(
        struct ggml_context * ctx,
        struct ggml_tensor  * a) {
    GGML_ASSERT(ggml_is_matrix(a));
    GGML_ASSERT(a->ne[0] <= INT32_MAX);

    struct ggml_tensor * result = ggml_new_tensor_1d(ctx, GGML_TYPE_I32, a->ne[1]);

    result->op     = GGML_OP_ARGMAX;
    result->src[0] = a;

    return result;
}